

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  ImVector<ImGuiDockRequest> *this;
  ImChunkStream<ImGuiWindowSettings> *this_00;
  byte bVar1;
  ImGuiID IVar2;
  ImGuiContext_conflict1 *ctx;
  uint uVar3;
  ImGuiDockNode *pIVar4;
  ImGuiDockRequest *pIVar5;
  ImGuiDockNode **ppIVar6;
  ImGuiWindowSettings *p;
  int n_2;
  int n;
  int iVar7;
  int n_3;
  int n_1;
  int i;
  ImVector<ImGuiStorage::ImGuiStoragePair> *this_01;
  ImGuiDockNode *local_88;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  ImGuiDockNode *node;
  ImGuiContext_conflict1 *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ImVector<ImGuiStorage::ImGuiStoragePair> *local_38;
  
  local_58 = GImGui;
  this_01 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)&GImGui->DockContext;
  iVar7 = 0;
  if (root_id == 0) {
    local_40 = 0;
    local_88 = (ImGuiDockNode *)0x0;
    local_48 = 0;
  }
  else {
    local_88 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr((ImGuiStorage *)this_01,root_id);
    if (local_88 == (ImGuiDockNode *)0x0) {
      return;
    }
    local_40 = (ulong)(*(ushort *)&local_88->field_0xbc & 7);
    local_48 = (ulong)(*(ushort *)&local_88->field_0xbc & 0x38);
  }
  nodes_to_remove.Size = 0;
  nodes_to_remove.Capacity = 0;
  nodes_to_remove.Data = (ImGuiDockNode **)0x0;
  this = &(local_58->DockContext).Requests;
  local_50 = 0;
  local_38 = this_01;
  for (; iVar7 < this_01->Size; iVar7 = iVar7 + 1) {
    pIVar4 = (ImGuiDockNode *)ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](this_01,iVar7);
    node = *(ImGuiDockNode **)&pIVar4->LocalFlags;
    if ((node != (ImGuiDockNode *)0x0) &&
       ((root_id == 0 ||
        ((node->ID != root_id && (pIVar4 = DockNodeGetRootNode(pIVar4), pIVar4->ID == root_id))))))
    {
      pIVar4 = node;
      bVar1 = *(byte *)((long)&node->MergedFlags + 1);
      if (root_id != 0) {
        for (i = 0; this_01 = local_38, i < this->Size; i = i + 1) {
          pIVar5 = ImVector<ImGuiDockRequest>::operator[](this,i);
          if (pIVar5->DockTargetNode == pIVar4) {
            pIVar5 = ImVector<ImGuiDockRequest>::operator[](this,i);
            pIVar5->Type = ImGuiDockRequestType_None;
          }
        }
        if (root_id != 0) {
          DockNodeMoveWindows(local_88,node);
          DockSettingsRenameNodeReferences(node->ID,local_88->ID);
        }
      }
      ImVector<ImGuiDockNode_*>::push_back(&nodes_to_remove,&node);
      local_50 = CONCAT71((int7)(local_50 >> 8),(byte)local_50 | (bVar1 & 8) >> 3);
    }
  }
  if (root_id != 0) {
    *(ushort *)&local_88->field_0xbc =
         (ushort)local_48 | (ushort)local_40 | (ushort)*(undefined4 *)&local_88->field_0xbc & 0xffc0
    ;
  }
  this_00 = &local_58->SettingsWindows;
  p = (ImGuiWindowSettings *)(local_58->SettingsWindows).Buf.Data;
  if (p != (ImGuiWindowSettings *)0x0) {
    p = (ImGuiWindowSettings *)&p->Pos;
  }
  do {
    if (p == (ImGuiWindowSettings *)0x0) {
      if (1 < (long)nodes_to_remove.Size) {
        qsort(nodes_to_remove.Data,(long)nodes_to_remove.Size,8,DockNodeComparerDepthMostFirst);
      }
      ctx = local_58;
      for (iVar7 = 0; iVar7 < nodes_to_remove.Size; iVar7 = iVar7 + 1) {
        ppIVar6 = ImVector<ImGuiDockNode_*>::operator[](&nodes_to_remove,iVar7);
        DockContextRemoveNode(ctx,*ppIVar6,false);
      }
      if (root_id == 0) {
        ImVector<ImGuiStorage::ImGuiStoragePair>::clear(local_38);
        ImVector<ImGuiDockRequest>::clear(this);
      }
      else if ((local_50 & 1) != 0) {
        local_88->CentralNode = local_88;
        uVar3 = local_88->LocalFlags | 0x800;
        local_88->LocalFlags = uVar3;
        local_88->MergedFlags = local_88->SharedFlags | local_88->LocalFlagsInWindows | uVar3;
      }
      ImVector<ImGuiDockNode_*>::~ImVector(&nodes_to_remove);
      return;
    }
    IVar2 = p->DockId;
    if (IVar2 != 0) {
      iVar7 = 0;
      do {
        if (nodes_to_remove.Size <= iVar7) goto LAB_0018aa8e;
        ppIVar6 = ImVector<ImGuiDockNode_*>::operator[](&nodes_to_remove,iVar7);
        iVar7 = iVar7 + 1;
      } while ((*ppIVar6)->ID != IVar2);
      p->DockId = root_id;
    }
LAB_0018aa8e:
    p = ImChunkStream<ImGuiWindowSettings>::next_chunk(this_00,p);
  } while( true );
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc  = &ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                {
                    DockNodeMoveWindows(root_node, node);
                    DockSettingsRenameNodeReferences(node->ID, root_node->ID);
                }
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->CentralNode = root_node;
        root_node->SetLocalFlags(root_node->LocalFlags | ImGuiDockNodeFlags_CentralNode);
    }
}